

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void OPN2_Reset(ym3438_t *chip,Bit32u rate,Bit32u clock)

{
  long lVar1;
  Bit32s BVar2;
  
  BVar2 = chip->rateratio;
  memset(chip,0,0x8560);
  builtin_memcpy(chip->eg_state,
                 "\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03"
                 ,0x18);
  lVar1 = -0x18;
  do {
    (chip->eg_kon + lVar1 * 2)[0] = 0xff;
    (chip->eg_kon + lVar1 * 2)[1] = '\x03';
    chip->eg_out[lVar1] = 0x3ff;
    chip->sl[lVar1] = '\x01';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  builtin_memcpy(chip->pan_l,"\x01\x01\x01\x01\x01\x01",6);
  builtin_memcpy(chip->pan_r,"\x01\x01\x01\x01\x01\x01",6);
  lVar1 = -6;
  do {
    chip->pan_volume_r[lVar1] = 0xb504;
    chip->pan_volume_r[lVar1 + 6] = 0xb504;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  if (rate != 0) {
    BVar2 = (Bit32s)(((ulong)rate * 0x24000) / (ulong)clock);
  }
  chip->rateratio = BVar2;
  return;
}

Assistant:

void OPN2_Reset(ym3438_t *chip, Bit32u rate, Bit32u clock)
{
    Bit32u i, rateratio;
    rateratio = (Bit32u)chip->rateratio;
    memset(chip, 0, sizeof(ym3438_t));
    for (i = 0; i < 24; i++)
    {
        chip->eg_out[i] = 0x3ff;
        chip->eg_level[i] = 0x3ff;
        chip->eg_state[i] = eg_num_release;
        chip->multi[i] = 1;
    }
    for (i = 0; i < 6; i++)
    {
        chip->pan_l[i] = 1;
        chip->pan_r[i] = 1;
        chip->pan_volume_l[i] = 46340;
        chip->pan_volume_r[i] = 46340;
    }

    if (rate != 0)
    {
        chip->rateratio = (Bit32s)(Bit32u)((((Bit64u)144 * rate) << RSM_FRAC) / clock);
    }
    else
    {
        chip->rateratio = (Bit32s)rateratio;
    }
}